

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.h
# Opt level: O0

void __thiscall SVGChart::PStyle::~PStyle(PStyle *this)

{
  PStyle *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&this->mVar);
  std::__cxx11::string::~string((string *)&this->mPenStyle);
  std::__cxx11::string::~string((string *)&this->mFont);
  return;
}

Assistant:

PStyle (): mFontSize(10), mPenWidth (1){}